

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::skip_variable_marker(jpeg_decoder *this)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = get_bits(this,0x10);
  if (uVar1 < 2) {
    stop_decoding(this,JPGD_BAD_VARIABLE_MARKER);
  }
  for (iVar2 = uVar1 - 2; iVar2 != 0; iVar2 = iVar2 + -1) {
    get_bits(this,8);
  }
  return;
}

Assistant:

void jpeg_decoder::skip_variable_marker()
{
  uint num_left;

  num_left = get_bits(16);

  if (num_left < 2)
    stop_decoding(JPGD_BAD_VARIABLE_MARKER);

  num_left -= 2;

  while (num_left)
  {
    get_bits(8);
    num_left--;
  }
}